

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

bool ON_Locale::SetCurrentCulture(ON_Locale *current_culture_locale)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *__locale;
  char local_88 [128];
  
  pcVar2 = local_88;
  memcpy(&m_CurrentCulture,current_culture_locale,0x9c);
  local_88[0x70] = '\0';
  local_88[0x71] = '\0';
  local_88[0x72] = '\0';
  local_88[0x73] = '\0';
  local_88[0x74] = '\0';
  local_88[0x75] = '\0';
  local_88[0x76] = '\0';
  local_88[0x77] = '\0';
  local_88[0x78] = '\0';
  local_88[0x79] = '\0';
  local_88[0x7a] = '\0';
  local_88[0x7b] = '\0';
  local_88[0x7c] = '\0';
  local_88[0x7d] = '\0';
  local_88[0x7e] = '\0';
  local_88[0x7f] = '\0';
  local_88[0x60] = '\0';
  local_88[0x61] = '\0';
  local_88[0x62] = '\0';
  local_88[99] = '\0';
  local_88[100] = '\0';
  local_88[0x65] = '\0';
  local_88[0x66] = '\0';
  local_88[0x67] = '\0';
  local_88[0x68] = '\0';
  local_88[0x69] = '\0';
  local_88[0x6a] = '\0';
  local_88[0x6b] = '\0';
  local_88[0x6c] = '\0';
  local_88[0x6d] = '\0';
  local_88[0x6e] = '\0';
  local_88[0x6f] = '\0';
  local_88[0x50] = '\0';
  local_88[0x51] = '\0';
  local_88[0x52] = '\0';
  local_88[0x53] = '\0';
  local_88[0x54] = '\0';
  local_88[0x55] = '\0';
  local_88[0x56] = '\0';
  local_88[0x57] = '\0';
  local_88[0x58] = '\0';
  local_88[0x59] = '\0';
  local_88[0x5a] = '\0';
  local_88[0x5b] = '\0';
  local_88[0x5c] = '\0';
  local_88[0x5d] = '\0';
  local_88[0x5e] = '\0';
  local_88[0x5f] = '\0';
  local_88[0x40] = '\0';
  local_88[0x41] = '\0';
  local_88[0x42] = '\0';
  local_88[0x43] = '\0';
  local_88[0x44] = '\0';
  local_88[0x45] = '\0';
  local_88[0x46] = '\0';
  local_88[0x47] = '\0';
  local_88[0x48] = '\0';
  local_88[0x49] = '\0';
  local_88[0x4a] = '\0';
  local_88[0x4b] = '\0';
  local_88[0x4c] = '\0';
  local_88[0x4d] = '\0';
  local_88[0x4e] = '\0';
  local_88[0x4f] = '\0';
  local_88[0x30] = '\0';
  local_88[0x31] = '\0';
  local_88[0x32] = '\0';
  local_88[0x33] = '\0';
  local_88[0x34] = '\0';
  local_88[0x35] = '\0';
  local_88[0x36] = '\0';
  local_88[0x37] = '\0';
  local_88[0x38] = '\0';
  local_88[0x39] = '\0';
  local_88[0x3a] = '\0';
  local_88[0x3b] = '\0';
  local_88[0x3c] = '\0';
  local_88[0x3d] = '\0';
  local_88[0x3e] = '\0';
  local_88[0x3f] = '\0';
  local_88[0x20] = '\0';
  local_88[0x21] = '\0';
  local_88[0x22] = '\0';
  local_88[0x23] = '\0';
  local_88[0x24] = '\0';
  local_88[0x25] = '\0';
  local_88[0x26] = '\0';
  local_88[0x27] = '\0';
  local_88[0x28] = '\0';
  local_88[0x29] = '\0';
  local_88[0x2a] = '\0';
  local_88[0x2b] = '\0';
  local_88[0x2c] = '\0';
  local_88[0x2d] = '\0';
  local_88[0x2e] = '\0';
  local_88[0x2f] = '\0';
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88[0x14] = '\0';
  local_88[0x15] = '\0';
  local_88[0x16] = '\0';
  local_88[0x17] = '\0';
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0x1e] = '\0';
  local_88[0x1f] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  lVar3 = 0;
  do {
    if (lVar3 == 0x80) {
      local_88[0x70] = '\0';
      local_88[0x71] = '\0';
      local_88[0x72] = '\0';
      local_88[0x73] = '\0';
      local_88[0x74] = '\0';
      local_88[0x75] = '\0';
      local_88[0x76] = '\0';
      local_88[0x77] = '\0';
      local_88[0x78] = '\0';
      local_88[0x79] = '\0';
      local_88[0x7a] = '\0';
      local_88[0x7b] = '\0';
      local_88[0x7c] = '\0';
      local_88[0x7d] = '\0';
      local_88[0x7e] = '\0';
      local_88[0x7f] = '\0';
      local_88[0x60] = '\0';
      local_88[0x61] = '\0';
      local_88[0x62] = '\0';
      local_88[99] = '\0';
      local_88[100] = '\0';
      local_88[0x65] = '\0';
      local_88[0x66] = '\0';
      local_88[0x67] = '\0';
      local_88[0x68] = '\0';
      local_88[0x69] = '\0';
      local_88[0x6a] = '\0';
      local_88[0x6b] = '\0';
      local_88[0x6c] = '\0';
      local_88[0x6d] = '\0';
      local_88[0x6e] = '\0';
      local_88[0x6f] = '\0';
      local_88[0x50] = '\0';
      local_88[0x51] = '\0';
      local_88[0x52] = '\0';
      local_88[0x53] = '\0';
      local_88[0x54] = '\0';
      local_88[0x55] = '\0';
      local_88[0x56] = '\0';
      local_88[0x57] = '\0';
      local_88[0x58] = '\0';
      local_88[0x59] = '\0';
      local_88[0x5a] = '\0';
      local_88[0x5b] = '\0';
      local_88[0x5c] = '\0';
      local_88[0x5d] = '\0';
      local_88[0x5e] = '\0';
      local_88[0x5f] = '\0';
      local_88[0x40] = '\0';
      local_88[0x41] = '\0';
      local_88[0x42] = '\0';
      local_88[0x43] = '\0';
      local_88[0x44] = '\0';
      local_88[0x45] = '\0';
      local_88[0x46] = '\0';
      local_88[0x47] = '\0';
      local_88[0x48] = '\0';
      local_88[0x49] = '\0';
      local_88[0x4a] = '\0';
      local_88[0x4b] = '\0';
      local_88[0x4c] = '\0';
      local_88[0x4d] = '\0';
      local_88[0x4e] = '\0';
      local_88[0x4f] = '\0';
      local_88[0x30] = '\0';
      local_88[0x31] = '\0';
      local_88[0x32] = '\0';
      local_88[0x33] = '\0';
      local_88[0x34] = '\0';
      local_88[0x35] = '\0';
      local_88[0x36] = '\0';
      local_88[0x37] = '\0';
      local_88[0x38] = '\0';
      local_88[0x39] = '\0';
      local_88[0x3a] = '\0';
      local_88[0x3b] = '\0';
      local_88[0x3c] = '\0';
      local_88[0x3d] = '\0';
      local_88[0x3e] = '\0';
      local_88[0x3f] = '\0';
      local_88[0x20] = '\0';
      local_88[0x21] = '\0';
      local_88[0x22] = '\0';
      local_88[0x23] = '\0';
      local_88[0x24] = '\0';
      local_88[0x25] = '\0';
      local_88[0x26] = '\0';
      local_88[0x27] = '\0';
      local_88[0x28] = '\0';
      local_88[0x29] = '\0';
      local_88[0x2a] = '\0';
      local_88[0x2b] = '\0';
      local_88[0x2c] = '\0';
      local_88[0x2d] = '\0';
      local_88[0x2e] = '\0';
      local_88[0x2f] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = '\0';
      local_88[0x19] = '\0';
      local_88[0x1a] = '\0';
      local_88[0x1b] = '\0';
      local_88[0x1c] = '\0';
      local_88[0x1d] = '\0';
      local_88[0x1e] = '\0';
      local_88[0x1f] = '\0';
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = '\0';
      local_88[9] = '\0';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      pcVar2 = (char *)0x0;
      break;
    }
    cVar1 = current_culture_locale->m_bcp47_language_tag[lVar3];
    local_88[lVar3] = cVar1;
    lVar3 = lVar3 + 1;
  } while (cVar1 != '\0');
  if (pcVar2 == (char *)0x0) {
    __locale = "C";
  }
  else {
    __locale = "C";
    if (*pcVar2 != '\0') {
      __locale = pcVar2;
    }
  }
  setlocale(6,__locale);
  setlocale(1,"C");
  return true;
}

Assistant:

bool ON_Locale::SetCurrentCulture(
  const ON_Locale& current_culture_locale
  )
{
  ON_Locale::m_CurrentCulture = current_culture_locale;

  char buffer[ON_Locale::BUFFER_MAXIMUM_CAPACITY] = { 0 };
  size_t buffer_capacity = sizeof(buffer) / sizeof(buffer[0]);
  const char* s = nullptr;

  if (false == current_culture_locale.IsOrdinalOrInvariantCulture())
  {
#if defined(ON_RUNTIME_WIN)
    // Windows sometimes appends _<sortorder>
    s = current_culture_locale.GetWindowsLocaleName(buffer,buffer_capacity);
#elif defined(ON_RUNTIME_APPLE)
    // Apple puts an _ before <REGION>
    s = current_culture_locale.GetAppleLocaleName(buffer,buffer_capacity);
#else
    // The current "standard" ?
    s = current_culture_locale.GetBCP47LanguageTag(buffer, buffer_capacity);
#endif
  }

  // String collate and mapping functions should use the locale for the name.
  if ( nullptr == s || 0 == s[0] )
  {
    setlocale(LC_ALL,"C");
  }
  else
  {
    setlocale(LC_ALL,s);
  }

  // number parsing and formatting use a decimal point in all cases.
  setlocale(LC_NUMERIC,"C");

  return true;
}